

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qframe.cpp
# Opt level: O0

bool __thiscall QFrame::event(QFrame *this,QEvent *e)

{
  byte bVar1;
  Type TVar2;
  QEvent *in_RSI;
  bool result;
  QEvent *in_stack_00000128;
  QWidget *in_stack_00000130;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  
  TVar2 = QEvent::type(in_RSI);
  if (TVar2 == ParentChange) {
    d_func((QFrame *)0x49e5d5);
    QFramePrivate::updateFrameWidth
              ((QFramePrivate *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
  }
  bVar1 = QWidget::event(in_stack_00000130,in_stack_00000128);
  TVar2 = QEvent::type(in_RSI);
  if (TVar2 == Polish) {
    d_func((QFrame *)0x49e60b);
    QFramePrivate::updateFrameWidth((QFramePrivate *)CONCAT17(bVar1,in_stack_ffffffffffffffe8));
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool QFrame::event(QEvent *e)
{
    if (e->type() == QEvent::ParentChange)
        d_func()->updateFrameWidth();
    bool result = QWidget::event(e);
    //this has to be done after the widget has been polished
    if (e->type() == QEvent::Polish)
        d_func()->updateFrameWidth();
    return result;
}